

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::UpdateCostData(cmCTestMultiProcessHandler *this)

{
  PropertiesMap *__x;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  ostream *poVar8;
  mapped_type *ppcVar9;
  _Base_ptr p_Var10;
  string *f;
  pointer pbVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  pVar12;
  int index;
  string tmpout;
  string name;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string line;
  PropertiesMap temp;
  ofstream fout;
  ifstream fin;
  int local_514;
  cmCTestMultiProcessHandler *local_510;
  string local_508;
  string local_4e8;
  string local_4c8;
  double local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a0;
  string local_488;
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  local_468;
  undefined1 local_438 [248];
  ios_base local_340 [264];
  istream local_238;
  
  local_510 = this;
  cmCTest::GetCostDataFile_abi_cxx11_(&local_4c8,this->CTest);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_508,local_4c8._M_dataplus._M_p,
             local_4c8._M_dataplus._M_p + local_4c8._M_string_length);
  std::__cxx11::string::append((char *)&local_508);
  std::ofstream::ofstream(local_438);
  std::ofstream::open(local_438,(_Ios_Openmode)local_508._M_dataplus._M_p);
  __x = &local_510->Properties;
  std::
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ::_Rb_tree(&local_468,
             (_Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              *)__x);
  bVar4 = cmsys::SystemTools::FileExists(&local_4c8);
  if (bVar4) {
    std::ifstream::ifstream(&local_238);
    std::ifstream::open((char *)&local_238,(_Ios_Openmode)local_4c8._M_dataplus._M_p);
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    local_488._M_string_length = 0;
    local_488.field_2._M_local_buf[0] = '\0';
    while( true ) {
      cVar5 = std::ios::widen((char)local_238._vptr_basic_istream[-3] + (char)&local_238);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (&local_238,(string *)&local_488,cVar5);
      if (((&piVar7->field_0x20)[(long)piVar7->_vptr_basic_istream[-3]] & 5) != 0) break;
      iVar6 = std::__cxx11::string::compare((char *)&local_488);
      if (iVar6 == 0) break;
      cmsys::SystemTools::SplitString(&local_4a0,&local_488,' ',false);
      if ((ulong)((long)local_4a0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_4a0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4a0);
        break;
      }
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      pcVar2 = ((local_4a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e8,pcVar2,
                 pcVar2 + (local_4a0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      pbVar11 = local_4a0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar6 = atoi(local_4a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
      local_4a8 = atof(pbVar11[2]._M_dataplus._M_p);
      local_514 = SearchByName(local_510,&local_4e8);
      if (local_514 == -1) {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_438,local_4e8._M_dataplus._M_p,
                            local_4e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        poVar8 = std::ostream::_M_insert<double>((double)(float)local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      }
      else {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_438,local_4e8._M_dataplus._M_p,
                            local_4e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        ppcVar9 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&__x->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,&local_514);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,(*ppcVar9)->PreviousRuns);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        ppcVar9 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&__x->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,&local_514);
        poVar8 = std::ostream::_M_insert<double>((double)(*ppcVar9)->Cost);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        pVar12 = std::
                 _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                 ::equal_range(&local_468,&local_514);
        std::
        _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
        ::_M_erase_aux(&local_468,(_Base_ptr)pVar12.first._M_node,(_Base_ptr)pVar12.second._M_node);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4a0);
    }
    std::ifstream::close();
    cmsys::SystemTools::RemoveFile(&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,
                      CONCAT71(local_488.field_2._M_allocated_capacity._1_7_,
                               local_488.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(&local_238);
  }
  p_Var1 = &local_468._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_468._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var10 = local_468._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_438,(char *)p_Var10[1]._M_parent[1]._M_parent,
                          (long)p_Var10[1]._M_parent[1]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      poVar8 = (ostream *)
               std::ostream::operator<<(poVar8,*(int *)&p_Var10[1]._M_parent[0xd]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      poVar8 = std::ostream::_M_insert<double>
                         ((double)*(float *)&p_Var10[1]._M_parent[0xd].field_0x4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"---\n",4);
  pbVar11 = (local_510->Failed->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (local_510->Failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != pbVar3) {
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_438,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar3);
  }
  std::ofstream::close();
  cmSystemTools::RenameFile(&local_508,&local_4c8);
  std::
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ::~_Rb_tree(&local_468);
  local_438._0_8_ = _VTT;
  *(undefined8 *)(local_438 + (long)_VTT[-3]) = _EVP_PKEY_get_bn_param;
  std::filebuf::~filebuf((filebuf *)(local_438 + 8));
  std::ios_base::~ios_base(local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::UpdateCostData()
{
  std::string fname = this->CTest->GetCostDataFile();
  std::string tmpout = fname + ".tmp";
  cmsys::ofstream fout;
  fout.open(tmpout.c_str());

  PropertiesMap temp = this->Properties;

  if (cmSystemTools::FileExists(fname)) {
    cmsys::ifstream fin;
    fin.open(fname.c_str());

    std::string line;
    while (std::getline(fin, line)) {
      if (line == "---") {
        break;
      }
      std::vector<std::string> parts = cmSystemTools::SplitString(line, ' ');
      // Format: <name> <previous_runs> <avg_cost>
      if (parts.size() < 3) {
        break;
      }

      std::string name = parts[0];
      int prev = atoi(parts[1].c_str());
      float cost = static_cast<float>(atof(parts[2].c_str()));

      int index = this->SearchByName(name);
      if (index == -1) {
        // This test is not in memory. We just rewrite the entry
        fout << name << " " << prev << " " << cost << "\n";
      } else {
        // Update with our new average cost
        fout << name << " " << this->Properties[index]->PreviousRuns << " "
             << this->Properties[index]->Cost << "\n";
        temp.erase(index);
      }
    }
    fin.close();
    cmSystemTools::RemoveFile(fname);
  }

  // Add all tests not previously listed in the file
  for (auto const& i : temp) {
    fout << i.second->Name << " " << i.second->PreviousRuns << " "
         << i.second->Cost << "\n";
  }

  // Write list of failed tests
  fout << "---\n";
  for (std::string const& f : *this->Failed) {
    fout << f << "\n";
  }
  fout.close();
  cmSystemTools::RenameFile(tmpout, fname);
}